

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

void j2k_add_mhmarker(opj_codestream_info_t *cstr_info,unsigned_short type,int pos,int len)

{
  int iVar1;
  opj_marker_info_t *poVar2;
  
  iVar1 = cstr_info->marknum;
  if (iVar1 < cstr_info->maxmarknum) {
    poVar2 = cstr_info->marker;
  }
  else {
    iVar1 = (int)(float)cstr_info->maxmarknum + 100;
    cstr_info->maxmarknum = iVar1;
    poVar2 = (opj_marker_info_t *)realloc(cstr_info->marker,(long)iVar1);
    cstr_info->marker = poVar2;
    iVar1 = cstr_info->marknum;
  }
  poVar2[iVar1].type = type;
  poVar2[iVar1].pos = (long)pos;
  poVar2[iVar1].len = len;
  cstr_info->marknum = iVar1 + 1;
  return;
}

Assistant:

static void j2k_add_mhmarker(opj_codestream_info_t *cstr_info, unsigned short int type, int pos, int len)
{
	assert(cstr_info != 00);

	/* expand the list? */
	if ((cstr_info->marknum + 1) > cstr_info->maxmarknum) {
		cstr_info->maxmarknum = 100 + (int) ((float) cstr_info->maxmarknum * 1.0F);
		cstr_info->marker = (opj_marker_info_t*)opj_realloc(cstr_info->marker, cstr_info->maxmarknum);
	}

	/* add the marker */
	cstr_info->marker[cstr_info->marknum].type = type;
	cstr_info->marker[cstr_info->marknum].pos = pos;
	cstr_info->marker[cstr_info->marknum].len = len;
	cstr_info->marknum++;

}